

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O2

void WriteAperiodicity(char *filename,int fs,int f0_length,double frame_period,int fft_size,
                      int number_of_dimensions,double **aperiodicity)

{
  FILE *__s;
  ulong uVar1;
  
  __s = fopen(filename,"wb");
  if (__s != (FILE *)0x0) {
    fwrite("AP  ",1,4,__s);
    anon_unknown.dwarf_e67a::WriteOneParameter((FILE *)__s,"NOF ",(double)f0_length,4);
    anon_unknown.dwarf_e67a::WriteOneParameter((FILE *)__s,"FP  ",frame_period,8);
    anon_unknown.dwarf_e67a::WriteOneParameter((FILE *)__s,"FFT ",(double)fft_size,4);
    anon_unknown.dwarf_e67a::WriteOneParameter((FILE *)__s,"NOD ",(double)number_of_dimensions,4);
    anon_unknown.dwarf_e67a::WriteOneParameter((FILE *)__s,"FS  ",(double)fs,4);
    if (number_of_dimensions == 0) {
      number_of_dimensions = fft_size / 2 + 1;
    }
    uVar1 = 0;
    if (f0_length < 1) {
      f0_length = 0;
    }
    for (; (uint)f0_length != uVar1; uVar1 = uVar1 + 1) {
      fwrite(aperiodicity[uVar1],8,(long)number_of_dimensions,__s);
    }
    fclose(__s);
    return;
  }
  puts("File cannot be opened.");
  return;
}

Assistant:

void WriteAperiodicity(const char *filename, int fs, int f0_length,
    double frame_period, int fft_size, int number_of_dimensions,
    const double * const *aperiodicity) {
  FILE *fp = fopen(filename, "wb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return;
  }

  // Header
  fwrite("AP  ", 1, 4, fp);

  // Parameters
  WriteOneParameter(fp, "NOF ", f0_length, 4);
  WriteOneParameter(fp, "FP  ", frame_period, 8);
  WriteOneParameter(fp, "FFT ", fft_size, 4);
  WriteOneParameter(fp, "NOD ", number_of_dimensions, 4);
  WriteOneParameter(fp, "FS  ", fs, 4);
  number_of_dimensions =
    number_of_dimensions == 0 ? fft_size / 2 + 1 : number_of_dimensions;

  // Data
  for (int i = 0; i < f0_length; ++i)
    fwrite(aperiodicity[i], 8, number_of_dimensions, fp);
  fclose(fp);
}